

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_array_scan_state.cpp
# Opt level: O2

ArrowArrayScanState * __thiscall
duckdb::ArrowArrayScanState::GetChild(ArrowArrayScanState *this,idx_t child_idx)

{
  iterator iVar1;
  pointer pAVar2;
  type pAVar3;
  unique_ptr<duckdb::ArrowArrayScanState,_std::default_delete<duckdb::ArrowArrayScanState>,_true>
  *this_00;
  templated_unique_single_t child_p;
  unique_ptr<duckdb::ArrowArrayScanState,_std::default_delete<duckdb::ArrowArrayScanState>_>
  uStack_28;
  idx_t local_20;
  
  local_20 = child_idx;
  iVar1 = ::std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::ArrowArrayScanState,_std::default_delete<duckdb::ArrowArrayScanState>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::ArrowArrayScanState,_std::default_delete<duckdb::ArrowArrayScanState>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->children)._M_h,&local_20);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::ArrowArrayScanState,_std::default_delete<duckdb::ArrowArrayScanState>,_true>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    make_uniq<duckdb::ArrowArrayScanState,duckdb::ArrowScanLocalState&,duckdb::ClientContext&>
              ((duckdb *)&uStack_28,this->state,this->context);
    pAVar3 = unique_ptr<duckdb::ArrowArrayScanState,_std::default_delete<duckdb::ArrowArrayScanState>,_true>
             ::operator*((unique_ptr<duckdb::ArrowArrayScanState,_std::default_delete<duckdb::ArrowArrayScanState>,_true>
                          *)&uStack_28);
    shared_ptr<duckdb::ArrowArrayWrapper,_true>::operator=(&pAVar3->owned_data,&this->owned_data);
    ::std::
    _Hashtable<unsigned_long,std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::ArrowArrayScanState,std::default_delete<duckdb::ArrowArrayScanState>,true>>,std::allocator<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::ArrowArrayScanState,std::default_delete<duckdb::ArrowArrayScanState>,true>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _M_emplace<unsigned_long&,duckdb::unique_ptr<duckdb::ArrowArrayScanState,std::default_delete<duckdb::ArrowArrayScanState>,true>>
              ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::ArrowArrayScanState,std::default_delete<duckdb::ArrowArrayScanState>,true>>,std::allocator<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::ArrowArrayScanState,std::default_delete<duckdb::ArrowArrayScanState>,true>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&this->children,&local_20,&uStack_28);
    ::std::
    unique_ptr<duckdb::ArrowArrayScanState,_std::default_delete<duckdb::ArrowArrayScanState>_>::
    ~unique_ptr(&uStack_28);
  }
  else {
    this_00 = (unique_ptr<duckdb::ArrowArrayScanState,_std::default_delete<duckdb::ArrowArrayScanState>,_true>
               *)((long)iVar1.
                        super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::ArrowArrayScanState,_std::default_delete<duckdb::ArrowArrayScanState>,_true>_>,_false>
                        ._M_cur + 0x10);
    pAVar2 = unique_ptr<duckdb::ArrowArrayScanState,_std::default_delete<duckdb::ArrowArrayScanState>,_true>
             ::operator->(this_00);
    if ((pAVar2->owned_data).internal.
        super___shared_ptr<duckdb::ArrowArrayWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      pAVar2 = unique_ptr<duckdb::ArrowArrayScanState,_std::default_delete<duckdb::ArrowArrayScanState>,_true>
               ::operator->(this_00);
      shared_ptr<duckdb::ArrowArrayWrapper,_true>::operator=(&pAVar2->owned_data,&this->owned_data);
    }
    pAVar3 = unique_ptr<duckdb::ArrowArrayScanState,_std::default_delete<duckdb::ArrowArrayScanState>,_true>
             ::operator*(this_00);
  }
  return pAVar3;
}

Assistant:

ArrowArrayScanState &ArrowArrayScanState::GetChild(idx_t child_idx) {
	auto it = children.find(child_idx);
	if (it == children.end()) {
		auto child_p = make_uniq<ArrowArrayScanState>(state, context);
		auto &child = *child_p;
		child.owned_data = owned_data;
		children.emplace(child_idx, std::move(child_p));
		return child;
	}
	if (!it->second->owned_data) {
		// Propagate down the ownership, for dictionaries in children
		D_ASSERT(owned_data);
		it->second->owned_data = owned_data;
	}
	return *it->second;
}